

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::FieldMask::_InternalParse(FieldMask *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  int iVar2;
  void *pvVar3;
  Arena *this_01;
  Rep *pRVar4;
  internal *this_02;
  char *size;
  bool bVar5;
  string *s;
  Rep *field_name;
  int iVar6;
  UnknownFieldSet *unknown;
  byte *pbVar7;
  uint res;
  pair<const_char_*,_unsigned_int> pVar8;
  StringPiece str;
  byte *local_38;
  
  local_38 = (byte *)ptr;
  bVar5 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar5) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    do {
      bVar1 = *local_38;
      res = (uint)bVar1;
      pbVar7 = local_38 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar7 * 0x80) - 0x80;
        if ((char)*pbVar7 < '\0') {
          pVar8 = internal::ReadTagFallback((char *)local_38,res);
          pbVar7 = (byte *)pVar8.first;
          if (pbVar7 == (byte *)0x0) {
            return (char *)0x0;
          }
          res = pVar8.second;
        }
        else {
          pbVar7 = local_38 + 2;
        }
      }
      if (res == 10) {
        local_38 = pbVar7 + -1;
        do {
          local_38 = local_38 + 1;
          field_name = (this->paths_).super_RepeatedPtrFieldBase.rep_;
          if (field_name == (Rep *)0x0) {
            iVar6 = (this->paths_).super_RepeatedPtrFieldBase.total_size_;
LAB_002b830b:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->paths_).super_RepeatedPtrFieldBase,iVar6 + 1);
            field_name = (this->paths_).super_RepeatedPtrFieldBase.rep_;
            iVar6 = field_name->allocated_size;
LAB_002b831b:
            field_name->allocated_size = iVar6 + 1;
            this_01 = (this->paths_).super_RepeatedPtrFieldBase.arena_;
            if (this_01 == (Arena *)0x0) {
              s = (string *)operator_new(0x20);
            }
            else {
              if (this_01->hooks_cookie_ != (void *)0x0) {
                Arena::OnArenaAllocation(this_01,(type_info *)&std::__cxx11::string::typeinfo,0x20);
              }
              s = (string *)
                  internal::ArenaImpl::AllocateAlignedAndAddCleanup
                            (&this_01->impl_,0x20,
                             internal::arena_destruct_object<std::__cxx11::string>);
            }
            (s->_M_dataplus)._M_p = (pointer)&s->field_2;
            s->_M_string_length = 0;
            (s->field_2)._M_local_buf[0] = '\0';
            pRVar4 = (this->paths_).super_RepeatedPtrFieldBase.rep_;
            iVar6 = (this->paths_).super_RepeatedPtrFieldBase.current_size_;
            field_name = (Rep *)(long)iVar6;
            (this->paths_).super_RepeatedPtrFieldBase.current_size_ = iVar6 + 1;
            pRVar4->elements[(long)field_name] = s;
          }
          else {
            iVar2 = (this->paths_).super_RepeatedPtrFieldBase.current_size_;
            iVar6 = field_name->allocated_size;
            if (iVar6 <= iVar2) {
              if (iVar6 == (this->paths_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002b830b;
              goto LAB_002b831b;
            }
            (this->paths_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            s = (string *)field_name->elements[iVar2];
          }
          local_38 = (byte *)internal::InlineGreedyStringParser(s,(char *)local_38,ctx);
          this_02 = (internal *)(s->_M_dataplus)._M_p;
          size = (char *)s->_M_string_length;
          if ((long)size < 0) {
            StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
          }
          str.length_ = (stringpiece_ssize_type)"google.protobuf.FieldMask.paths";
          str.ptr_ = size;
          bVar5 = internal::VerifyUTF8(this_02,str,(char *)field_name);
          if (!bVar5) {
            return (char *)0x0;
          }
          if (local_38 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 10));
      }
      else {
        if ((res == 0) || ((res & 7) == 4)) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)pbVar7;
        }
        pvVar3 = this_00->ptr_;
        local_38 = pbVar7;
        if (((ulong)pvVar3 & 1) == 0) {
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
        }
        else {
          unknown = (UnknownFieldSet *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8);
        }
        local_38 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
        if (local_38 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      bVar5 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar5);
  }
  return (char *)local_38;
}

Assistant:

const char* FieldMask::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated string paths = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            auto str = _internal_add_paths();
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
            CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.FieldMask.paths"));
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}